

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O1

void __thiscall
miyuki::serialize::InputArchive::_load<std::shared_ptr<Bar>>
          (InputArchive *this,
          vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *vec)

{
  pointer *ppsVar1;
  pointer *pprVar2;
  pointer *ppiVar3;
  value_t vVar4;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  iterator __position;
  pointer pbVar5;
  pointer pcVar6;
  bool bVar7;
  char cVar8;
  size_t sVar9;
  const_reference ref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  ulong uVar10;
  char cVar11;
  ulong idx;
  string __str;
  long *local_70;
  uint local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  idx = 0;
  do {
    this_00 = (this->stack).
              super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]._M_data;
    vVar4 = this_00->m_type;
    sVar9 = (size_t)vVar4;
    if (vVar4 != null) {
      if (vVar4 == object) {
        sVar9 = (((this_00->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      }
      else if (vVar4 == array) {
        sVar9 = (long)(((this_00->m_value).array)->
                      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(((this_00->m_value).array)->
                      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4;
      }
      else {
        sVar9 = 1;
      }
    }
    if (sVar9 <= idx) {
      return;
    }
    ref = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::at(this_00,idx);
    _makeNode(this,ref);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/","");
    cVar11 = '\x01';
    if (9 < idx) {
      uVar10 = idx;
      cVar8 = '\x04';
      do {
        cVar11 = cVar8;
        if (uVar10 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_001167f4;
        }
        if (uVar10 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_001167f4;
        }
        if (uVar10 < 10000) goto LAB_001167f4;
        bVar7 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar8 = cVar11 + '\x04';
      } while (bVar7);
      cVar11 = cVar11 + '\x01';
    }
LAB_001167f4:
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,idx);
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::_M_append((char *)local_50,(ulong)local_70);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,__args);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    __position._M_current =
         (vec->super__Vector_base<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (vec->super__Vector_base<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>::_M_realloc_insert<>
                (vec,__position);
    }
    else {
      ((__position._M_current)->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      ((__position._M_current)->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ppsVar1 = &(vec->
                 super__Vector_base<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppsVar1 = *ppsVar1 + 1;
    }
    _load<Bar>(this,(vec->
                    super__Vector_base<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish + -1);
    pbVar5 = (this->super_ArchiveBase).locator.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->super_ArchiveBase).locator.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar5 + -1;
    pcVar6 = pbVar5[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != &pbVar5[-1].field_2) {
      operator_delete(pcVar6,pbVar5[-1].field_2._M_allocated_capacity + 1);
    }
    pprVar2 = &(this->stack).
               super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar2 = *pprVar2 + -1;
    ppiVar3 = &(this->counter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppiVar3 = *ppiVar3 + -1;
    idx = idx + 1;
  } while( true );
}

Assistant:

void _load(std::vector<T> &vec) {
            for (size_t i = 0; i < _top().size(); i++) {
                _makeNode(_top().at(i));
                locator.emplace_back(std::string("/").append(std::to_string(i)));
                vec.emplace_back();
                _load(vec.back());
                locator.pop_back();
                _popNode();
            }
        }